

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_parameter_validation.cpp
# Opt level: O0

ze_result_t __thiscall
validation_layer::ZEParameterValidation::zeImageGetPropertiesPrologue
          (ZEParameterValidation *this,ze_device_handle_t hDevice,ze_image_desc_t *desc,
          ze_image_properties_t *pImageProperties)

{
  _ze_result_t retVal;
  ze_image_properties_t *pImageProperties_local;
  ze_image_desc_t *desc_local;
  ze_device_handle_t hDevice_local;
  ZEParameterValidation *this_local;
  
  if (hDevice == (ze_device_handle_t)0x0) {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  else if (desc == (ze_image_desc_t *)0x0) {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else if (pImageProperties == (ze_image_properties_t *)0x0) {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else if (desc->flags < 4) {
    if ((int)desc->type < 6) {
      this_local._4_4_ = ParameterValidation::validateExtensions<_ze_image_desc_t_const*>(desc);
      if (this_local._4_4_ == ZE_RESULT_SUCCESS) {
        this_local._4_4_ =
             ParameterValidation::validateExtensions<_ze_image_properties_t*>(pImageProperties);
      }
    }
    else {
      this_local._4_4_ = ZE_RESULT_ERROR_INVALID_ENUMERATION;
    }
  }
  else {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_ENUMERATION;
  }
  return this_local._4_4_;
}

Assistant:

ze_result_t
    ZEParameterValidation::zeImageGetPropertiesPrologue(
        ze_device_handle_t hDevice,                     ///< [in] handle of the device
        const ze_image_desc_t* desc,                    ///< [in] pointer to image descriptor
        ze_image_properties_t* pImageProperties         ///< [out] pointer to image properties
        )
    {
        if( nullptr == hDevice )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == desc )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == pImageProperties )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( 0x3 < desc->flags )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        if( ZE_IMAGE_TYPE_BUFFER < desc->type )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        auto retVal = ZE_RESULT_SUCCESS;
        retVal = ParameterValidation::validateExtensions(desc);
        if(retVal)
            return retVal;
        retVal = ParameterValidation::validateExtensions(pImageProperties);
        return retVal;
    }